

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var.cpp
# Opt level: O2

void __thiscall IntVar::specialiseToLL(IntVar *this)

{
  int iVar1;
  
  iVar1 = (*(this->super_Var).super_Branching._vptr_Branching[3])();
  if ((iVar1 != 4) && (iVar1 != 2)) {
    if (iVar1 == 1) {
      IntVarLL::IntVarLL((IntVarLL *)this,this);
      return;
    }
    fprintf(_stderr,"%s:%d: ","int-var.cpp",0x65);
    fwrite("Assertion failed.\n",0x12,1,_stderr);
    abort();
  }
  return;
}

Assistant:

void IntVar::specialiseToLL() {
	switch (getType()) {
		case INT_VAR_EL:
		case INT_VAR_SL:
			return;
		case INT_VAR:
			new (this) IntVarLL(*((IntVar*)this));
			break;
		default:
			NEVER;
	}
}